

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamhdr.c
# Opt level: O0

void nn_streamhdr_init(nn_streamhdr *self,int src,nn_fsm *owner)

{
  nn_fsm *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_stack_00000008;
  undefined4 in_stack_fffffffffffffff0;
  
  nn_fsm_init(&self->fsm,(nn_fsm_fn)CONCAT44(src,in_stack_00000008),(nn_fsm_fn)owner,
              (int)((ulong)in_RDI >> 0x20),(void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX
             );
  *(undefined4 *)(in_RDI + 0x58) = 1;
  nn_timer_init((nn_timer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20),
                (nn_fsm *)0x16404a);
  nn_fsm_event_init((nn_fsm_event *)0x16405b);
  *(undefined8 *)(in_RDI + 0x148) = 0;
  *(undefined4 *)(in_RDI + 0x150) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x158) = 0;
  *(undefined8 *)(in_RDI + 0x160) = 0;
  return;
}

Assistant:

void nn_streamhdr_init (struct nn_streamhdr *self, int src,
    struct nn_fsm *owner)
{
    nn_fsm_init (&self->fsm, nn_streamhdr_handler, nn_streamhdr_shutdown,
        src, self, owner);
    self->state = NN_STREAMHDR_STATE_IDLE;
    nn_timer_init (&self->timer, NN_STREAMHDR_SRC_TIMER, &self->fsm);
    nn_fsm_event_init (&self->done);

    self->usock = NULL;
    self->usock_owner.src = -1;
    self->usock_owner.fsm = NULL;
    self->pipebase = NULL;
}